

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O1

MergeResult
mergesort_cache_lcp_2way<false,unsigned_int>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,
          uint *cache_input,uint *cache_output,size_t n)

{
  size_t __n;
  uchar **strings_output_00;
  byte *pbVar1;
  byte *pbVar2;
  uchar *puVar3;
  int iVar4;
  bool bVar5;
  MergeResult MVar6;
  ostream *poVar7;
  ostream *poVar8;
  uint uVar9;
  MergeResult MVar10;
  uint *puVar11;
  ulong uVar12;
  uchar **ppuVar13;
  lcp_t *plVar14;
  lcp_t *plVar15;
  byte bVar16;
  byte bVar17;
  long lVar18;
  size_t i_1;
  lcp_t lVar19;
  lcp_t in_R11;
  uint *cache_input1;
  ulong uVar20;
  char local_91;
  uint *local_90;
  MergeResult local_84;
  uint *local_80;
  lcp_t *local_78;
  size_t local_70;
  lcp_t *local_68;
  lcp_t *local_60;
  uchar **local_58;
  uchar **local_50;
  uint *local_48;
  uchar **local_40;
  ulong local_38;
  
  local_68 = lcp_output;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"mergesort_cache_lcp_2way",0x18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(): n=",6);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  local_91 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_91,1);
  plVar14 = local_68;
  if (0x1f < n) {
    uVar20 = n >> 1;
    MVar6 = mergesort_cache_lcp_2way<true,unsigned_int>
                      (strings_input,strings_output,lcp_input,local_68,cache_input,cache_output,
                       uVar20);
    puVar11 = cache_input;
    plVar15 = lcp_input;
    ppuVar13 = strings_input;
    if (MVar6 != SortedInPlace) {
      puVar11 = cache_output;
      plVar15 = plVar14;
      ppuVar13 = strings_output;
    }
    check_input<unsigned_int>(ppuVar13,plVar15,puVar11,uVar20);
    ppuVar13 = strings_input + uVar20;
    strings_output_00 = strings_output + uVar20;
    plVar15 = lcp_input + uVar20;
    local_78 = plVar14 + uVar20;
    puVar11 = cache_input + uVar20;
    local_90 = cache_output + uVar20;
    local_70 = n - uVar20;
    local_80 = cache_input;
    local_40 = strings_output;
    local_38 = uVar20;
    local_84 = mergesort_cache_lcp_2way<true,unsigned_int>
                         (ppuVar13,strings_output_00,plVar15,local_78,puVar11,local_90,local_70);
    plVar14 = local_78;
    cache_input1 = local_90;
    local_60 = plVar15;
    local_58 = strings_output_00;
    local_50 = ppuVar13;
    local_48 = puVar11;
    if (MVar6 == SortedInPlace) {
      check_input<unsigned_int>(ppuVar13,plVar15,puVar11,local_70);
      plVar14 = local_78;
      cache_input1 = local_90;
    }
    else {
      check_input<unsigned_int>(strings_output_00,local_78,local_90,local_70);
    }
    uVar20 = local_38;
    ppuVar13 = local_40;
    MVar10 = local_84;
    if (MVar6 != local_84) {
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"Warning: extra copying due to m0 != m1. n=",0x2a);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      ppuVar13 = local_40;
      __n = uVar20 * 8;
      local_90 = (uint *)(uVar20 * 4);
      if (MVar6 == SortedInPlace) {
        memmove(local_40,strings_input,__n);
        memcpy(cache_output,local_80,(size_t)local_90);
        memcpy(local_68,lcp_input,__n);
        MVar6 = SortedInTemp;
        plVar14 = local_78;
        MVar10 = local_84;
      }
      else {
        memmove(strings_input,local_40,__n);
        memcpy(local_80,cache_output,(size_t)local_90);
        memcpy(lcp_input,local_68,__n);
        plVar14 = local_78;
        MVar10 = SortedInTemp;
      }
    }
    if (MVar6 == MVar10) {
      if (MVar6 == SortedInPlace) {
        merge_cache_lcp_2way<false,unsigned_int>
                  (strings_input,lcp_input,local_80,uVar20,local_50,local_60,local_48,local_70,
                   ppuVar13,local_68,cache_output);
      }
      else {
        merge_cache_lcp_2way<false,unsigned_int>
                  (ppuVar13,local_68,cache_output,uVar20,local_58,plVar14,cache_input1,local_70,
                   strings_input,lcp_input,local_80);
      }
      return (uint)(MVar6 == SortedInPlace);
    }
    __assert_fail("m0 == m1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x56e,
                  "MergeResult mergesort_cache_lcp_2way(unsigned char **, unsigned char **, lcp_t *__restrict, lcp_t *__restrict, CharT *__restrict, CharT *__restrict, size_t) [OutputLCP = false, CharT = unsigned int]"
                 );
  }
  if (1 < (long)n) {
    uVar20 = n & 0xffffffff;
    poVar8 = (ostream *)strings_input;
    do {
      iVar4 = (int)uVar20;
      uVar20 = (ulong)(iVar4 - 1);
      pbVar1 = *(byte **)(poVar8 + 8);
      poVar8 = poVar8 + 8;
      for (poVar7 = poVar8; strings_input < poVar7; poVar7 = poVar7 + -8) {
        pbVar2 = *(byte **)(poVar7 + -8);
        bVar16 = *pbVar2;
        bVar17 = *pbVar1;
        in_R11 = CONCAT71((int7)(in_R11 >> 8),bVar16 != bVar17);
        if (bVar16 != 0 && bVar16 == bVar17) {
          in_R11 = 1;
          do {
            bVar16 = pbVar2[in_R11];
            bVar17 = pbVar1[in_R11];
            if (bVar16 == 0) break;
            in_R11 = in_R11 + 1;
          } while (bVar16 == bVar17);
        }
        if (bVar16 <= bVar17) break;
        *(byte **)poVar7 = pbVar2;
      }
      *(byte **)poVar7 = pbVar1;
    } while (2 < iVar4);
  }
  pbVar1 = *strings_input;
  lVar18 = 0;
  poVar8 = (ostream *)0x0;
  do {
    if ((pbVar1[lVar18] == 0) || (pbVar1[lVar18] != strings_input[1][lVar18])) {
      bVar5 = false;
      poVar7 = poVar8;
    }
    else {
      poVar8 = poVar8 + 1;
      bVar5 = true;
    }
    lVar18 = lVar18 + 1;
  } while (bVar5);
  *lcp_input = (lcp_t)poVar7;
  if (pbVar1 != (byte *)0x0) {
    if (*pbVar1 == 0) {
      uVar9 = 0;
    }
    else {
      uVar9 = (uint)*pbVar1 << 0x18;
      if (pbVar1[1] != 0) {
        uVar9 = uVar9 | (uint)pbVar1[1] << 0x10;
        if (pbVar1[2] != 0) {
          uVar9 = uVar9 | CONCAT11(pbVar1[2],pbVar1[3]);
        }
      }
    }
    *cache_input = uVar9;
    if (1 < n - 1) {
      uVar20 = 1;
      do {
        puVar3 = strings_input[uVar20];
        uVar12 = (ulong)((int)uVar20 + 1);
        lVar18 = 0;
        lVar19 = 0;
        do {
          if ((puVar3[lVar18] == '\0') || (puVar3[lVar18] != strings_input[uVar12][lVar18])) {
            bVar5 = false;
            in_R11 = lVar19;
          }
          else {
            lVar19 = lVar19 + 1;
            bVar5 = true;
          }
          lVar18 = lVar18 + 1;
        } while (bVar5);
        lcp_input[uVar20] = in_R11;
        if (puVar3 == (uchar *)0x0) goto LAB_00249050;
        lVar19 = lcp_input[(int)uVar20 - 1];
        if (puVar3[lVar19] == 0) {
          uVar9 = 0;
        }
        else {
          uVar9 = (uint)puVar3[lVar19] << 0x18;
          if (puVar3[lVar19 + 1] != 0) {
            uVar9 = uVar9 | (uint)puVar3[lVar19 + 1] << 0x10;
            if (puVar3[lVar19 + 2] != '\0') {
              uVar9 = uVar9 | CONCAT11(puVar3[lVar19 + 2],puVar3[lVar19 + 3]);
            }
          }
        }
        cache_input[uVar20] = uVar9;
        uVar20 = uVar12;
      } while (uVar12 < n - 1);
    }
    puVar3 = strings_input[n - 1];
    if (puVar3 != (uchar *)0x0) {
      lVar19 = lcp_input[n - 2];
      uVar9 = 0;
      if (puVar3[lVar19] != 0) {
        uVar9 = (uint)puVar3[lVar19] << 0x18;
        if (puVar3[lVar19 + 1] != 0) {
          uVar9 = (uint)puVar3[lVar19 + 1] << 0x10 | uVar9;
          if (puVar3[lVar19 + 2] != '\0') {
            uVar9 = uVar9 | CONCAT11(puVar3[lVar19 + 2],puVar3[lVar19 + 3]);
          }
        }
      }
      cache_input[n - 1] = uVar9;
      check_input<unsigned_int>(strings_input,lcp_input,cache_input,n);
      return SortedInPlace;
    }
  }
LAB_00249050:
  __assert_fail("ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                ,0x38,"uint32_t get_char(unsigned char *, size_t)");
}

Assistant:

MergeResult
mergesort_cache_lcp_2way(
              unsigned char** strings_input, unsigned char** strings_output,
              lcp_t* restrict lcp_input, lcp_t* restrict lcp_output,
              CharT* restrict cache_input, CharT* restrict cache_output,
              size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		lcp_input[0] = lcp(strings_input[0], strings_input[1]);
		cache_input[0] = get_char<CharT>(strings_input[0], 0);
		for (unsigned i=1; i < n-1; ++i) {
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
			cache_input[i] = get_char<CharT>(strings_input[i], lcp_input[i-1]);
		}
		cache_input[n-1] = get_char<CharT>(strings_input[n-1], lcp_input[n-2]);
		check_input(strings_input, lcp_input, cache_input, n);
		return SortedInPlace;
	}
	const size_t split0 = n/2;
	MergeResult m0 = mergesort_cache_lcp_2way<true>(
			strings_input, strings_output,
			lcp_input, lcp_output,
			cache_input, cache_output,
			split0);

	if (m0==SortedInPlace) check_input(strings_input, lcp_input, cache_input, split0);
	else                   check_input(strings_output, lcp_output, cache_output, split0);

	MergeResult m1 = mergesort_cache_lcp_2way<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0, lcp_output+split0,
			cache_input+split0, cache_output+split0,
			n-split0);

	if (m0==SortedInPlace) check_input(strings_input+split0, lcp_input+split0, cache_input+split0, n-split0);
	else                   check_input(strings_output+split0, lcp_output+split0, cache_output+split0, n-split0);

	if (m0 != m1) {
		debug() << "Warning: extra copying due to m0 != m1. n="<<n<<"\n";
		if (m0 == SortedInPlace) {
			std::copy(strings_input, strings_input+split0,
					strings_output);
			std::copy(cache_input, cache_input+split0,
					cache_output);
			std::copy(lcp_input, lcp_input+split0,
					lcp_output);
			m0 = SortedInTemp;
		} else {
			std::copy(strings_output, strings_output+split0,
					strings_input);
			std::copy(cache_output, cache_output+split0,
					cache_input);
			std::copy(lcp_output, lcp_output+split0,
					lcp_input);
			m1 = SortedInTemp;
		}
	}
	assert(m0 == m1);
	if (m0 == SortedInPlace) {
		merge_cache_lcp_2way<OutputLCP>(
			strings_input, lcp_input, cache_input, split0,
			strings_input+split0, lcp_input+split0, cache_input+split0, n-split0,
			strings_output, lcp_output, cache_output);
		return SortedInTemp;
	} else {
		merge_cache_lcp_2way<OutputLCP>(
			strings_output, lcp_output, cache_output, split0,
			strings_output+split0, lcp_output+split0, cache_output+split0, n-split0,
			strings_input, lcp_input, cache_input);
		return SortedInPlace;
	}
}